

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<unsigned_long&,long&,long&,long&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,unsigned_long *args,long *args_1
               ,long *args_2,long *args_3)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args_00;
  string sStack_98;
  unsigned_long local_78 [2];
  long local_68;
  long local_58;
  long local_48;
  
  aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )args_2;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_78[0] = *args;
    local_68 = *args_1;
    local_58 = *args_2;
    local_48 = *args_3;
    bVar3 = ::fmt::v7::to_string_view<char,_0>(fmt);
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0x3334;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar2.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_78;
    ::fmt::v7::detail::vformat_abi_cxx11_(&sStack_98,(detail *)bVar3.data_,format_str,args_00);
    WriteLog(source,lvl,&sStack_98);
    ::std::__cxx11::string::~string((string *)&sStack_98);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}